

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Learn.cpp
# Opt level: O3

int __thiscall Qclass::futurereward(Qclass *this,int new_state)

{
  int iVar1;
  long lVar2;
  double dVar3;
  double dVar4;
  
  iVar1 = -100000;
  if (new_state < 0x9c4) {
    lVar2 = 0;
    dVar3 = -100000.0;
    do {
      dVar4 = this->Q[new_state][lVar2];
      if (dVar4 <= dVar3) {
        dVar4 = dVar3;
      }
      lVar2 = lVar2 + 1;
      dVar3 = dVar4;
    } while (lVar2 != 4);
    iVar1 = (int)dVar4;
  }
  return iVar1;
}

Assistant:

int Qclass::futurereward(int new_state) {
  double currMax = -100000;
  if (new_state > 2499) {
    currMax = -100000;
  } else {   // Finds future reward benefits for state,action pair
    for (int i = 0; i < 4; i++) {
      if (Q[new_state][i] > currMax) {
        currMax = Q[new_state][i];
      }
    }
  }
  return currMax;
}